

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O0

shared_ptr<create::Packet> __thiscall create::Data::getPacket(Data *this,uint8_t id)

{
  bool bVar1;
  mapped_type *pmVar2;
  uint8_t in_DL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined7 in_register_00000031;
  Data *this_00;
  shared_ptr<create::Packet> sVar4;
  key_type local_19;
  Data *pDStack_18;
  uint8_t id_local;
  Data *this_local;
  
  this_00 = (Data *)CONCAT71(in_register_00000031,id);
  pDStack_18 = this_00;
  this_local = this;
  bVar1 = isValidPacketID(this_00,in_DL);
  if (bVar1) {
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[]((map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                           *)this_00,&local_19);
    std::shared_ptr<create::Packet>::shared_ptr((shared_ptr<create::Packet> *)this,pmVar2);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::shared_ptr<create::Packet>::shared_ptr((shared_ptr<create::Packet> *)this);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<create::Packet>)
         sVar4.super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Packet> Data::getPacket(uint8_t id) {
    if (isValidPacketID(id)) {
      return packets[id];
    }
    return std::shared_ptr<Packet>();
  }